

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionParser.cpp
# Opt level: O0

unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>
primaryExpression(Tokenizer *tokenizer)

{
  Identifier *this;
  bool bVar1;
  Token *pTVar2;
  Tokenizer *in_RSI;
  undefined1 local_58 [8];
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> exp;
  string_view local_40;
  Identifier *local_30;
  Identifier *identifier;
  undefined8 local_20;
  Token *tok;
  Tokenizer *tokenizer_local;
  
  tok = (Token *)in_RSI;
  tokenizer_local = tokenizer;
  local_20 = Tokenizer::peekToken(in_RSI,0);
  switch(*(TokenType *)(local_20 + 0x10)) {
  case Invalid:
  default:
    std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>::
    unique_ptr<std::default_delete<ExpressionInternal>,void>
              ((unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>> *)tokenizer,
               (nullptr_t)0x0);
    break;
  case Identifier:
    local_30 = Token::identifierValue((Token *)local_20);
    Tokenizer::eatToken((Tokenizer *)tok);
    this = local_30;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_40,".");
    bVar1 = Identifier::operator==(this,local_40);
    if (bVar1) {
      std::make_unique<ExpressionInternal,OperatorType>((OperatorType *)tokenizer);
    }
    else {
      std::make_unique<ExpressionInternal,Identifier_const&>((Identifier *)tokenizer);
    }
    break;
  case Integer:
    Tokenizer::eatToken((Tokenizer *)tok);
    exp._M_t.super___uniq_ptr_impl<ExpressionInternal,_std::default_delete<ExpressionInternal>_>.
    _M_t.super__Tuple_impl<0UL,_ExpressionInternal_*,_std::default_delete<ExpressionInternal>_>.
    super__Head_base<0UL,_ExpressionInternal_*,_false>._M_head_impl =
         (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         Token::intValue((Token *)local_20);
    std::make_unique<ExpressionInternal,long>((long *)tokenizer);
    break;
  case String:
    Tokenizer::eatToken((Tokenizer *)tok);
    Token::stringValue((Token *)local_20);
    std::make_unique<ExpressionInternal,StringLiteral_const&>((StringLiteral *)tokenizer);
    break;
  case Float:
    Tokenizer::eatToken((Tokenizer *)tok);
    identifier = (Identifier *)Token::floatValue((Token *)local_20);
    std::make_unique<ExpressionInternal,double>((double *)tokenizer);
    break;
  case LParen:
    Tokenizer::eatToken((Tokenizer *)tok);
    expression((Tokenizer *)local_58);
    pTVar2 = Tokenizer::nextToken((Tokenizer *)tok);
    if (pTVar2->type == RParen) {
      std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::unique_ptr
                ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 tokenizer,
                 (unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)
                 local_58);
    }
    else {
      std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>::
      unique_ptr<std::default_delete<ExpressionInternal>,void>
                ((unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>> *)tokenizer
                 ,(nullptr_t)0x0);
    }
    std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>::~unique_ptr
              ((unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *)local_58)
    ;
  }
  return (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         (__uniq_ptr_data<ExpressionInternal,_std::default_delete<ExpressionInternal>,_true,_true>)
         tokenizer;
}

Assistant:

static std::unique_ptr<ExpressionInternal> primaryExpression(Tokenizer& tokenizer)
{
	const Token &tok = tokenizer.peekToken();

	switch (tok.type)
	{
	case TokenType::Float:
		tokenizer.eatToken();
		return std::make_unique<ExpressionInternal>(tok.floatValue());
	case TokenType::Identifier:
		{
			const Identifier &identifier = tok.identifierValue();
			tokenizer.eatToken();
			if (identifier == ".")
				return std::make_unique<ExpressionInternal>(OperatorType::MemoryPos);
			else
				return std::make_unique<ExpressionInternal>(identifier);
		}
	case TokenType::String:
		tokenizer.eatToken();
		return std::make_unique<ExpressionInternal>(tok.stringValue());
	case TokenType::Integer:
		tokenizer.eatToken();
		return std::make_unique<ExpressionInternal>(tok.intValue());
	case TokenType::LParen:
		{
			tokenizer.eatToken();
			std::unique_ptr<ExpressionInternal> exp = expression(tokenizer);

			if (tokenizer.nextToken().type != TokenType::RParen)
				return nullptr;

			return exp;
		}
	case TokenType::Invalid:
	default:
		break;
	}

	return nullptr;
}